

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measure.h
# Opt level: O2

ostream * __thiscall Measure<int>::Print(Measure<int> *this,ostream *out)

{
  long local_18;
  
  local_18 = (this->time).__d.__r / 1000000000;
  spdlog::info<char[40],std::__cxx11::string,MetricTypes::MetricType,long,int>
            ((char (*) [40])"name: {}, type: {}, time: {}, value: {}",&this->name,&this->type,
             &local_18,&this->value);
  PrintTags(this);
  return out;
}

Assistant:

std::ostream& Print(std::ostream& out) const  {
        spdlog::info("name: {}, type: {}, time: {}, value: {}", this->name, this->type, system_clock::to_time_t(this->time), this->value);
        PrintTags();
        return out;
    }